

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::i2p_connection::
open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_connection *this,string *hostname,int port,i2p_session_options *session_options,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  string *__lhs;
  int iVar1;
  element_type *peVar2;
  i2p_stream *this_00;
  int iVar3;
  int iVar4;
  __type_conflict1 _Var5;
  bool bVar6;
  i2p_session_options *out;
  difference_type extraout_RDX;
  span<char> buffer;
  span<const_char> in;
  i2p_connection *local_f0;
  __shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> local_e8;
  undefined1 local_d8 [32];
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:509:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_b8;
  char tmp [20];
  anon_class_24_2_fd512de0_for_m_handler local_68;
  string local_50 [32];
  
  __lhs = &this->m_hostname;
  out = session_options;
  _Var5 = ::std::operator==(__lhs,hostname);
  if (((_Var5) && (this->m_port == port)) &&
     ((this->m_sam_socket).super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    bVar6 = is_open(this);
    if (bVar6) {
      return;
    }
    if (this->m_state == sam_connecting) {
      return;
    }
  }
  ::std::__cxx11::string::_M_assign((string *)__lhs);
  this->m_port = port;
  if ((this->m_hostname)._M_string_length != 0) {
    this->m_state = sam_connecting;
    buffer.m_len = extraout_RDX;
    buffer.m_ptr = (char *)0x14;
    aux::random_bytes((aux *)tmp,buffer);
    ::std::__cxx11::string::resize((ulong)&this->m_session_id);
    in.m_len = (difference_type)(this->m_session_id)._M_dataplus._M_p;
    in.m_ptr = (char *)0x14;
    aux::to_hex((aux *)tmp,in,(char *)out);
    ::std::make_shared<libtorrent::i2p_stream,boost::asio::io_context&>((io_context *)local_d8);
    ::std::__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    peVar2 = (this->m_sam_socket).
             super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__cxx11::string::string(local_50,(string *)__lhs);
    iVar1 = this->m_port;
    ::std::__cxx11::string::operator=((string *)&(peVar2->super_proxy_base).m_hostname,local_50);
    (peVar2->super_proxy_base).m_port = iVar1;
    ::std::__cxx11::string::~string(local_50);
    peVar2 = (this->m_sam_socket).
             super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->m_command = cmd_create_session;
    peVar2->m_id = (this->m_session_id)._M_dataplus._M_p;
    iVar1 = session_options->m_outbound_quantity;
    iVar3 = session_options->m_inbound_length;
    iVar4 = session_options->m_outbound_length;
    (peVar2->m_session_options).m_inbound_quantity = session_options->m_inbound_quantity;
    (peVar2->m_session_options).m_outbound_quantity = iVar1;
    (peVar2->m_session_options).m_inbound_length = iVar3;
    (peVar2->m_session_options).m_outbound_length = iVar4;
    this_00 = (this->m_sam_socket).
              super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8._24_4_ = 0;
    local_d8[8] = '\0';
    local_d8[9] = '\0';
    local_d8[10] = '\0';
    local_d8[0xb] = '\0';
    local_d8[0xc] = '\0';
    local_d8[0xd] = '\0';
    local_d8[0xe] = '\0';
    local_d8[0xf] = '\0';
    local_d8._16_8_ = 0;
    local_d8._0_8_ = (element_type *)0x2;
    local_f0 = this;
    ::std::__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e8,(__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_68.this = (i2p_connection *)handler->_M_f;
    local_68.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)&handler->field_0x8;
    local_68.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (handler->_M_bound_args).
            super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
            super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
    aux::
    wrap_allocator<libtorrent::i2p_connection::open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::__cxx11::string_const&,int,libtorrent::i2p_session_options_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (&local_b8,(aux *)&local_f0,&local_68,
               (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)session_options);
    i2p_stream::
    async_connect<libtorrent::aux::wrap_allocator_t<libtorrent::i2p_connection::open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::__cxx11::string_const&,int,libtorrent::i2p_session_options_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
              (this_00,(endpoint_type *)local_d8,&local_b8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8.m_handler.s.
                super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  }
  return;
}

Assistant:

void open(std::string const& hostname, int port,
		i2p_session_options const& session_options, Handler handler)
	{
		// we already seem to have a session to this SAM router
		if (m_hostname == hostname
			&& m_port == port
			&& m_sam_socket
			&& (is_open() || m_state == sam_connecting)) return;

		m_hostname = hostname;
		m_port = port;

		if (m_hostname.empty()) return;

		m_state = sam_connecting;

		char tmp[20];
		aux::random_bytes(tmp);
		m_session_id.resize(sizeof(tmp)*2);
		aux::to_hex(tmp, &m_session_id[0]);

		m_sam_socket = std::make_shared<i2p_stream>(m_io_service);
		m_sam_socket->set_proxy(m_hostname, m_port);
		m_sam_socket->set_command(i2p_stream::cmd_create_session);
		m_sam_socket->set_session_id(m_session_id.c_str());
		m_sam_socket->set_session_options(session_options);

		ADD_OUTSTANDING_ASYNC("i2p_stream::on_sam_connect");
		m_sam_socket->async_connect(tcp::endpoint(), aux::wrap_allocator(
			[this,s=m_sam_socket](error_code const& ec, Handler hn) {
				on_sam_connect(ec, s, std::move(hn));
			}, std::move(handler)));
	}